

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

bool __thiscall
ThreadedReplayer::enqueue_create_graphics_pipeline
          (ThreadedReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  atomic<unsigned_int> *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pPVar5;
  pointer pDVar6;
  SharedControlBlock *pSVar7;
  uint uVar8;
  int iVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  VkPipeline local_38;
  
  uVar8 = create_info->flags & 0xfffffff9;
  create_info->flags = uVar8;
  create_info->basePipelineHandle = (VkPipeline)0x0;
  create_info->basePipelineIndex = -1;
  if ((this->opts).pipeline_stats == true) {
    create_info->flags = uVar8 | 0x40;
  }
  uVar8 = *(uint *)(in_FS_OFFSET + -0x18);
  pPVar5 = (this->per_thread_data).
           super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar12 = pPVar5[uVar8].expected_hash == hash;
  bVar13 = pPVar5[uVar8].expected_tag == RESOURCE_GRAPHICS_PIPELINE;
  local_38 = (VkPipeline)hash;
  if (bVar13 && bVar12) {
    uVar2 = create_info->flags;
    uVar3 = pPVar5[uVar8].current_parse_index;
    uVar11 = (ulong)uVar3;
    uVar4 = pPVar5[uVar8].memory_context_index;
    pPVar5[uVar8].acknowledge_parsing_work = true;
    if (pPVar5[uVar8].force_outside_range == false) {
      pDVar6 = this->deferred_graphics[uVar4].
               super__Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)this->deferred_graphics[uVar4].
                        super__Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 5) <= uVar11) {
        __assert_fail("index < deferred_graphics[memory_index].size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp"
                      ,0x888,
                      "virtual bool ThreadedReplayer::enqueue_create_graphics_pipeline(Hash, const VkGraphicsPipelineCreateInfo *, VkPipeline *)"
                     );
      }
      pDVar6[uVar11].info = create_info;
      *(Hash *)((long)(pDVar6 + uVar11) + 8) = hash;
      *(VkPipeline **)((long)(pDVar6 + uVar11) + 0x10) = pipeline;
      *(uint *)((long)(pDVar6 + uVar11) + 0x18) = uVar3;
    }
    else {
      iVar9 = pthread_mutex_lock((pthread_mutex_t *)&this->hash_lock);
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      if ((uVar2 >> 0xb & 1) != 0) {
        pmVar10 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->graphics_parents,(key_type *)&local_38);
        pmVar10->info = create_info;
        pmVar10->hash = (Hash)local_38;
        pmVar10->pipeline = pipeline;
        pmVar10->index = uVar3;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->hash_lock);
    }
    *pipeline = local_38;
    pSVar7 = (this->opts).control_block;
    if (pSVar7 != (SharedControlBlock *)0x0) {
      LOCK();
      paVar1 = &pSVar7->parsed_graphics;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
    }
  }
  else {
    enqueue_create_graphics_pipeline();
  }
  return bVar13 && bVar12;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		// Ignore derived pipelines, no relevant drivers use them.
		auto *info = const_cast<VkGraphicsPipelineCreateInfo *>(create_info);
		info->flags &= ~(VK_PIPELINE_CREATE_DERIVATIVE_BIT | VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT);
		info->basePipelineHandle = VK_NULL_HANDLE;
		info->basePipelineIndex = -1;

		if (opts.pipeline_stats)
			info->flags |= VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR;

		bool generates_library = (create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0;

		auto &per_thread = get_per_thread_data();
		unsigned index = per_thread.current_parse_index;
		unsigned memory_index = per_thread.memory_context_index;
		bool force_outside_range = per_thread.force_outside_range;

		if (per_thread.expected_hash != hash || per_thread.expected_tag != RESOURCE_GRAPHICS_PIPELINE)
		{
			LOGE("Unexpected resource type or hash in blob, ignoring.\n");
			return false;
		}

		per_thread.acknowledge_parsing_work = true;

		if (!force_outside_range)
		{
			assert(index < deferred_graphics[memory_index].size());
			deferred_graphics[memory_index][index] = {
				const_cast<VkGraphicsPipelineCreateInfo *>(create_info), hash, pipeline, index,
			};
		}
		else
		{
			lock_guard<mutex> holder(hash_lock);
			if (generates_library)
			{
				auto &p = graphics_parents[hash];
				p = { const_cast<VkGraphicsPipelineCreateInfo *>(create_info), hash, pipeline, index };
			}
		}

		*pipeline = (VkPipeline)hash;
		if (opts.control_block)
			opts.control_block->parsed_graphics.fetch_add(1, std::memory_order_relaxed);

		return true;
	}